

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

void __thiscall Parser::parse_objects_color_hex_code(Parser *this)

{
  string local_80;
  undefined1 local_60 [8];
  Token<ParsedGame::ObjectsTokenType> color_hex_code;
  string color_hex_code_str;
  Parser *this_local;
  
  parse_word_abi_cxx11_((string *)&color_hex_code.token_line,this);
  std::__cxx11::string::string((string *)&local_80,(string *)&color_hex_code.token_line);
  Token<ParsedGame::ObjectsTokenType>::Token
            ((Token<ParsedGame::ObjectsTokenType> *)local_60,ColorHexCode,&local_80,
             this->m_line_counter);
  std::__cxx11::string::~string((string *)&local_80);
  std::
  vector<Token<ParsedGame::ObjectsTokenType>,_std::allocator<Token<ParsedGame::ObjectsTokenType>_>_>
  ::push_back(&(this->m_parsed_game).objects_tokens,(value_type *)local_60);
  Token<ParsedGame::ObjectsTokenType>::~Token((Token<ParsedGame::ObjectsTokenType> *)local_60);
  std::__cxx11::string::~string((string *)&color_hex_code.token_line);
  return;
}

Assistant:

void Parser::parse_objects_color_hex_code()
{
	//todo make a more robust parse function and detect incorrect hex codes
	string color_hex_code_str = parse_word();
	Token<ParsedGame::ObjectsTokenType> color_hex_code(ParsedGame::ObjectsTokenType::ColorHexCode, color_hex_code_str, m_line_counter);
	m_parsed_game.objects_tokens.push_back(color_hex_code);
}